

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

bool_t botpHOTPStepV(char *otp,void *state)

{
  int iVar1;
  char *in_RSI;
  char *unaff_retaddr;
  botp_hotp_st *st;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  memCopy(in_RSI,in_stack_ffffffffffffffd8,0x15a5e4);
  botpHOTPStepR(unaff_retaddr,(void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
  ;
  iVar1 = strCmp(in_RSI,in_stack_ffffffffffffffd8);
  if (iVar1 != 0) {
    memCopy(in_RSI,in_stack_ffffffffffffffd8,0x15a635);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

bool_t botpHOTPStepV(const char* otp, void* state)
{
	botp_hotp_st* st = (botp_hotp_st*)state;
	// pre
	ASSERT(strIsValid(otp));
	ASSERT(memIsDisjoint2(otp, strLen(otp) + 1, state, botpHOTP_keep()));
	// сохранить счетчик
	memCopy(st->ctr1, st->ctr, 8);
	// проверить пароль
	botpHOTPStepR(st->otp, state);
	if (strEq(st->otp, otp))
		return TRUE;
	// вернуться к первоначальному счетчику
	memCopy(st->ctr, st->ctr1, 8);
	return FALSE;
}